

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::TexLookup::~TexLookup(TexLookup *this)

{
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__TexLookup_01e72980;
  if (this->m_coordExpr != (Expression *)0x0) {
    (*this->m_coordExpr->_vptr_Expression[1])();
  }
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    (*this->m_lodBiasExpr->_vptr_Expression[1])();
  }
  std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base
            ((_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)&this->m_value);
  VariableType::~VariableType(&this->m_valueType);
  return;
}

Assistant:

TexLookup::~TexLookup (void)
{
	delete m_coordExpr;
	delete m_lodBiasExpr;
}